

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
sexp_bytevector_s16_native_ref_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  undefined1 auVar1 [16];
  int16_t iVar2;
  int *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  sexp_conflict res;
  char *in_stack_ffffffffffffff98;
  char *arg0_00;
  sexp_conflict local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 8)) {
    if ((((ulong)in_R8 & 1) == 1) || ((((ulong)in_R8 & 3) == 0 && (*in_R8 == 0xc)))) {
      if (((ulong)in_R8 & 1) == 1) {
        auVar1._8_8_ = (long)in_R8 >> 0x3f;
        auVar1._0_8_ = (ulong)in_R8 & 0xfffffffffffffffe;
        arg0_00 = SUB168(auVar1 / SEXT816(2),0);
      }
      else if ((((ulong)in_R8 & 3) == 0) && (*in_R8 == 0xc)) {
        in_stack_ffffffffffffff98 = (char *)((long)(char)in_R8[2] * *(long *)(in_R8 + 6));
        arg0_00 = in_stack_ffffffffffffff98;
      }
      else {
        in_stack_ffffffffffffff98 = (char *)0x0;
        arg0_00 = in_stack_ffffffffffffff98;
      }
      iVar2 = bytevector_s16_native_ref(arg0_00,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      local_8 = (sexp_conflict)sexp_make_integer(in_RDI,(long)iVar2,(long)iVar2 >> 0x3f);
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_R8);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_RCX);
  }
  return local_8;
}

Assistant:

sexp sexp_bytevector_s16_native_ref_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_bytesp(arg0))
    return sexp_type_exception(ctx, self, SEXP_BYTES, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_integer(ctx, bytevector_s16_native_ref(sexp_bytes_data(arg0), sexp_sint_value(arg1)));
  return res;
}